

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O0

int BN_ucmp(BIGNUM *a,BIGNUM *b)

{
  unsigned_long *bp;
  unsigned_long *ap;
  unsigned_long t2;
  unsigned_long t1;
  int i;
  BIGNUM *b_local;
  BIGNUM *a_local;
  int local_4;
  
  local_4 = a->top - b->top;
  if (local_4 == 0) {
    i = a->top;
    do {
      i = i + -1;
      if (i < 0) {
        return 0;
      }
    } while (a->d[i] == b->d[i]);
    local_4 = -1;
    if (b->d[i] < a->d[i]) {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int BN_ucmp(const BIGNUM *a, const BIGNUM *b)
{
    int i;
    BN_ULONG t1, t2, *ap, *bp;

    bn_check_top(a);
    bn_check_top(b);

    i = a->top - b->top;
    if (i != 0)
        return (i);
    ap = a->d;
    bp = b->d;
    for (i = a->top - 1; i >= 0; i--) {
        t1 = ap[i];
        t2 = bp[i];
        if (t1 != t2)
            return ((t1 > t2) ? 1 : -1);
    }
    return (0);
}